

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2FilterHandlers.cpp
# Opt level: O0

void __thiscall
SAX2SortAttributesFilter::startElement
          (SAX2SortAttributesFilter *this,XMLCh *uri,XMLCh *localname,XMLCh *qname,
          Attributes *attributes)

{
  wchar16 *pwVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  Attr *pAVar4;
  wchar16 *pwVar5;
  XMLCh *pXVar6;
  Attr *pClone;
  XMLSize_t j;
  ulong local_70;
  XMLSize_t i;
  AttrList sortedList;
  Attributes *attributes_local;
  XMLCh *qname_local;
  XMLCh *localname_local;
  XMLCh *uri_local;
  SAX2SortAttributesFilter *this_local;
  
  sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.fMemoryManager =
       (MemoryManager *)attributes;
  iVar2 = (*attributes->_vptr_Attributes[2])();
  AttrList::AttrList((AttrList *)&i,CONCAT44(extraout_var,iVar2));
  local_70 = 0;
  do {
    uVar3 = (**(code **)(*(long *)sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.
                                  fMemoryManager + 0x10))();
    if (uVar3 <= local_70) {
      xercesc_4_0::SAX2XMLFilterImpl::startElement
                ((wchar16 *)this,uri,localname,(Attributes *)qname);
      AttrList::~AttrList((AttrList *)&i);
      return;
    }
    for (pClone = (Attr *)0x0; pAVar4 = (Attr *)AttrList::getLength((AttrList *)&i), pClone < pAVar4
        ; pClone = (Attr *)((long)&pClone->qName + 1)) {
      pAVar4 = xercesc_4_0::BaseRefVectorOf<Attr>::elementAt
                         ((BaseRefVectorOf<Attr> *)&sortedList,(XMLSize_t)pClone);
      pwVar1 = pAVar4->qName;
      pwVar5 = (wchar16 *)
               (**(code **)(*(long *)sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.
                                     fMemoryManager + 0x28))
                         (sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.
                          fMemoryManager,local_70);
      iVar2 = xercesc_4_0::XMLString::compareString(pwVar1,pwVar5);
      if (-1 < iVar2) break;
    }
    pAVar4 = (Attr *)operator_new(0x28);
    pXVar6 = (XMLCh *)(**(code **)(*(long *)sortedList.super_RefVectorOf<Attr>.
                                            super_BaseRefVectorOf<Attr>.fMemoryManager + 0x28))
                                (sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.
                                 fMemoryManager,local_70);
    pAVar4->qName = pXVar6;
    pXVar6 = (XMLCh *)(**(code **)(*(long *)sortedList.super_RefVectorOf<Attr>.
                                            super_BaseRefVectorOf<Attr>.fMemoryManager + 0x18))
                                (sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.
                                 fMemoryManager,local_70);
    pAVar4->uri = pXVar6;
    pXVar6 = (XMLCh *)(**(code **)(*(long *)sortedList.super_RefVectorOf<Attr>.
                                            super_BaseRefVectorOf<Attr>.fMemoryManager + 0x20))
                                (sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.
                                 fMemoryManager,local_70);
    pAVar4->localPart = pXVar6;
    pXVar6 = (XMLCh *)(**(code **)(*(long *)sortedList.super_RefVectorOf<Attr>.
                                            super_BaseRefVectorOf<Attr>.fMemoryManager + 0x38))
                                (sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.
                                 fMemoryManager,local_70);
    pAVar4->value = pXVar6;
    pXVar6 = (XMLCh *)(**(code **)(*(long *)sortedList.super_RefVectorOf<Attr>.
                                            super_BaseRefVectorOf<Attr>.fMemoryManager + 0x30))
                                (sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.
                                 fMemoryManager,local_70);
    pAVar4->attrType = pXVar6;
    xercesc_4_0::BaseRefVectorOf<Attr>::insertElementAt
              ((BaseRefVectorOf<Attr> *)&sortedList,pAVar4,(XMLSize_t)pClone);
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

void SAX2SortAttributesFilter::startElement(const   XMLCh* const    uri,
                                            const   XMLCh* const    localname,
                                            const   XMLCh* const    qname,
                                            const   Attributes&		attributes)
{
    AttrList sortedList(attributes.getLength());
    for(XMLSize_t i=0;i<attributes.getLength();i++)
    {
        XMLSize_t j;
        for(j=0;j<sortedList.getLength();j++)
        {
            if(XMLString::compareString(sortedList.elementAt(j)->qName,attributes.getQName(i))>=0)
                break;
        }
        Attr* pClone=new Attr;
        pClone->qName       = attributes.getQName(i);
        pClone->uri         = attributes.getURI(i);
        pClone->localPart   = attributes.getLocalName(i);
        pClone->value       = attributes.getValue(i);
        pClone->attrType    = attributes.getType(i);
        sortedList.insertElementAt(pClone, j);
    }
    SAX2XMLFilterImpl::startElement(uri, localname, qname, sortedList);
}